

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)22>_> *
vkt::anon_unknown_0::allocateDescriptorSet
          (Move<vk::Handle<(vk::HandleType)22>_> *__return_storage_ptr__,Context *context,
          VkDescriptorPool descriptorPool,VkDescriptorSetLayout setLayout)

{
  DeviceInterface *vk;
  VkDevice device;
  undefined1 local_50 [8];
  VkDescriptorSetAllocateInfo params;
  Context *context_local;
  VkDescriptorSetLayout setLayout_local;
  VkDescriptorPool descriptorPool_local;
  
  local_50._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  params.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  params._4_4_ = 0;
  params.descriptorPool.m_internal._0_4_ = 1;
  params._24_8_ = &context_local;
  params.pNext = (void *)descriptorPool.m_internal;
  params.pSetLayouts = (VkDescriptorSetLayout *)context;
  context_local = (Context *)setLayout.m_internal;
  setLayout_local.m_internal = descriptorPool.m_internal;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice((Context *)params.pSetLayouts);
  ::vk::allocateDescriptorSet
            (__return_storage_ptr__,vk,device,(VkDescriptorSetAllocateInfo *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Move<vk::VkDescriptorSet> allocateDescriptorSet (Context& context, vk::VkDescriptorPool descriptorPool, vk::VkDescriptorSetLayout setLayout)
{
	const vk::VkDescriptorSetAllocateInfo	params	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
		DE_NULL,
		descriptorPool,
		1u,
		&setLayout
	};

	return vk::allocateDescriptorSet(context.getDeviceInterface(), context.getDevice(), &params);
}